

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::StringParameter::ByteSizeLong(StringParameter *this)

{
  int iVar1;
  long lVar2;
  string *value;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  StringParameter *this_local;
  
  sStack_18 = 0;
  defaultvalue_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    value = defaultvalue_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sStack_18 = sStack_18 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t StringParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.StringParameter)
  size_t total_size = 0;

  // string defaultValue = 1;
  if (this->defaultvalue().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->defaultvalue());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}